

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O3

string * __thiscall
gnuplotio::Gnuplot::
file<std::vector<unsigned_short,std::allocator<unsigned_short>>,gnuplotio::Mode1D>
          (string *__return_storage_ptr__,Gnuplot *this,undefined4 *arg,string *filename)

{
  ostream *poVar1;
  ostringstream cmdline;
  fstream tmp_stream;
  undefined1 local_3b8 [384];
  string local_238 [16];
  
  if (*(long *)(filename + 8) == 0) {
    GnuplotTmpfileCollection::make_tmpfile_abi_cxx11_
              (local_238,
               (this->tmp_files).
               super___shared_ptr<gnuplotio::GnuplotTmpfileCollection,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    std::__cxx11::string::operator=(filename,(string *)local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
      operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
    }
  }
  std::fstream::fstream(local_238,*(char **)filename,_S_out);
  std::ios::copyfmt((ios *)((long)&local_238[0]._M_dataplus._M_p +
                           *(long *)(local_238[0]._M_dataplus._M_p + -0x18)));
  local_3b8._0_4_ = *arg;
  local_3b8._4_4_ = arg[1];
  local_3b8._8_4_ = arg[2];
  local_3b8._12_4_ = arg[3];
  print_block<1ul,gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,unsigned_short>,gnuplotio::ModeText>
            (&local_238[0].field_2);
  std::fstream::close();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8," \'",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_3b8,*(char **)filename,*(long *)(filename + 8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' ",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
  std::ios_base::~ios_base((ios_base *)(local_3b8 + 0x70));
  std::fstream::~fstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

std::string file(const T &arg, std::string filename, OrganizationMode) {
        if(filename.empty()) filename = make_tmpfile();
        std::fstream tmp_stream(filename.c_str(), std::fstream::out);
        tmp_stream.copyfmt(*this);
        top_level_array_sender(tmp_stream, arg, OrganizationMode(), ModeText());
        tmp_stream.close();

        std::ostringstream cmdline;
        // FIXME - hopefully filename doesn't contain quotes or such...
        cmdline << " '" << filename << "' ";
        return cmdline.str();
    }